

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O3

size_t __thiscall leveldb::RecoveryTest::RemoveLogFiles(RecoveryTest *this)

{
  Env *pEVar1;
  undefined8 *puVar2;
  ulong uVar3;
  size_t sVar4;
  char *message;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  RecoveryTest *local_88;
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> local_80 [8];
  undefined8 *local_78;
  string local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  AssertHelper local_38;
  
  if (this->db_ != (DB *)0x0) {
    (*this->db_->_vptr_DB[1])();
  }
  this->db_ = (DB *)0x0;
  GetFiles(&local_50,this,kLogFile);
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar4 = 0;
  }
  else {
    uVar3 = 0;
    local_88 = this;
    do {
      pEVar1 = local_88->env_;
      LogFileName(&local_70,&this->dbname_,
                  local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar3]);
      (*pEVar1->_vptr_Env[8])(&local_90,pEVar1,&local_70);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                (local_80,(char *)&local_38,(Status *)"env_->RemoveFile(LogName(logs[i]))");
      if (local_90._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete__(local_90._M_head_impl);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_80[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
        testing::Message::Message((Message *)&local_90);
        LogFileName(&local_70,&this->dbname_,
                    local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_90._M_head_impl + 0x10),local_70._M_dataplus._M_p,
                   local_70._M_string_length);
        message = "";
        if (local_78 != (undefined8 *)0x0) {
          message = (char *)*local_78;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                   ,0x68,message);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (local_90._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_90._M_head_impl + 8))();
        }
      }
      puVar2 = local_78;
      if (local_78 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_78 != local_78 + 2) {
          operator_delete((undefined8 *)*local_78);
        }
        operator_delete(puVar2);
      }
      uVar3 = uVar3 + 1;
      sVar4 = (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
    } while (uVar3 < sVar4);
  }
  if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return sVar4;
}

Assistant:

size_t RemoveLogFiles() {
    // Linux allows unlinking open files, but Windows does not.
    // Closing the db allows for file deletion.
    Close();
    std::vector<uint64_t> logs = GetFiles(kLogFile);
    for (size_t i = 0; i < logs.size(); i++) {
      EXPECT_LEVELDB_OK(env_->RemoveFile(LogName(logs[i]))) << LogName(logs[i]);
    }
    return logs.size();
  }